

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::InstallProjectViaInstallCommands
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  cmCPackLog *pcVar1;
  pointer pbVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  pointer command;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installCommandsVector;
  string output;
  string tmpFile;
  string tempInstallDirectoryEnv;
  char *local_410 [4];
  ostringstream cmCPackLog_msg;
  ostringstream cmCPackLog_msg_1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_INSTALL_COMMANDS",(allocator<char> *)&cmCPackLog_msg_1
            );
  pcVar4 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tempInstallDirectoryEnv,"CMAKE_INSTALL_PREFIX=",
               (allocator<char> *)&cmCPackLog_msg);
    std::__cxx11::string::append((string *)&tempInstallDirectoryEnv);
    cmsys::SystemTools::PutEnv(&tempInstallDirectoryEnv);
    installCommandsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    installCommandsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    installCommandsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,pcVar4,(allocator<char> *)&cmCPackLog_msg_1);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&installCommandsVector,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    pbVar2 = installCommandsVector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (command = installCommandsVector.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; command != pbVar2;
        command = command + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Execute: ");
      poVar5 = std::operator<<(poVar5,(string *)command);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x117,_cmCPackLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      output._M_dataplus._M_p = (pointer)&output.field_2;
      output._M_string_length = 0;
      output.field_2._M_local_buf[0] = '\0';
      retVal = 1;
      bVar3 = cmSystemTools::RunSingleCommand
                        (command,&output,&output,&retVal,(char *)0x0,this->GeneratorVerbose,
                         (cmDuration)0x0);
      if (!bVar3 || retVal != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",
                   (allocator<char> *)&cmCPackLog_msg_1);
        pcVar4 = GetOption(this,(string *)&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tmpFile,pcVar4,(allocator<char> *)local_410);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::append((char *)&tmpFile);
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&cmCPackLog_msg,&tmpFile,false,None);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"# Run command: ");
        poVar5 = std::operator<<(poVar5,(string *)command);
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"# Output:");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,(string *)&output);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem running install command: ");
        poVar5 = std::operator<<(poVar5,(string *)command);
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"Please check ");
        poVar5 = std::operator<<(poVar5,(string *)&tmpFile);
        poVar5 = std::operator<<(poVar5," for errors");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x128,local_410[0]);
        std::__cxx11::string::~string((string *)local_410);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&tmpFile);
        std::__cxx11::string::~string((string *)&output);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&installCommandsVector);
        std::__cxx11::string::~string((string *)&tempInstallDirectoryEnv);
        return 0;
      }
      std::__cxx11::string::~string((string *)&output);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&installCommandsVector);
    std::__cxx11::string::~string((string *)&tempInstallDirectoryEnv);
  }
  return 1;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallCommands(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  (void)setDestDir;
  const char* installCommands = this->GetOption("CPACK_INSTALL_COMMANDS");
  if (installCommands && *installCommands) {
    std::string tempInstallDirectoryEnv = "CMAKE_INSTALL_PREFIX=";
    tempInstallDirectoryEnv += tempInstallDirectory;
    cmSystemTools::PutEnv(tempInstallDirectoryEnv);
    std::vector<std::string> installCommandsVector;
    cmSystemTools::ExpandListArgument(installCommands, installCommandsVector);
    for (std::string const& ic : installCommandsVector) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << ic << std::endl);
      std::string output;
      int retVal = 1;
      bool resB = cmSystemTools::RunSingleCommand(
        ic, &output, &output, &retVal, nullptr, this->GeneratorVerbose,
        cmDuration::zero());
      if (!resB || retVal) {
        std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
        tmpFile += "/InstallOutput.log";
        cmGeneratedFileStream ofs(tmpFile);
        ofs << "# Run command: " << ic << std::endl
            << "# Output:" << std::endl
            << output << std::endl;
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem running install command: "
                        << ic << std::endl
                        << "Please check " << tmpFile << " for errors"
                        << std::endl);
        return 0;
      }
    }
  }
  return 1;
}